

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_test.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  pointer piVar2;
  istream *piVar3;
  ulong uVar4;
  ostream *poVar5;
  int iVar6;
  int i;
  int iVar7;
  int j;
  long lVar8;
  int j_2;
  ulong uVar9;
  int j_1;
  long lVar10;
  int l;
  int temp_1;
  int d;
  int b;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  bkList;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> liblist;
  int shiplimit;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> mp;
  vector<int,_std::allocator<int>_> booksScores;
  int local_ec;
  value_type local_e8;
  int local_e0;
  int local_dc;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_d8;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_b8;
  _Vector_base<int,_std::allocator<int>_> local_98;
  long local_80;
  undefined1 local_78 [8];
  pointer piStack_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  size_t local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x272c1b0) = 0;
  *(undefined8 *)(*(long *)(std::cout + -0x18) + 0x272c168) = 0;
  freopen("/mnt/sda3/Programming-Problem-Solutions/HashCode_2020/OnlineQualificationRound/a_example.txt"
          ,"r",_stdin);
  freopen("/mnt/sda3/Programming-Problem-Solutions/HashCode_2020/OnlineQualificationRound/a_example_output.txt"
          ,"w",_stdout);
  piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_dc);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&local_ec);
  std::istream::operator>>(piVar3,&local_e0);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (iVar7 = 0; iVar7 < local_dc; iVar7 = iVar7 + 1) {
    std::istream::operator>>((istream *)&std::cin,(int *)local_78);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_48,(value_type *)local_78);
  }
  for (lVar10 = 0; lVar10 < local_ec; lVar10 = lVar10 + 1) {
    piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,(int *)&local_b8);
    piVar3 = (istream *)std::istream::operator>>(piVar3,(int *)&local_d8);
    std::istream::operator>>(piVar3,(int *)&local_98);
    local_78 = (undefined1  [8])0x0;
    piStack_70 = (pointer)0x0;
    local_68 = (_Base_ptr)0x0;
    for (iVar7 = 0; iVar7 < (int)local_b8._M_impl.super__Vector_impl_data._M_start;
        iVar7 = iVar7 + 1) {
      std::istream::operator>>((istream *)&std::cin,&local_e8.first);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_78,&local_e8.first);
    }
    libraries[lVar10].libraryNo = (int)lVar10;
    libraries[lVar10].noOfBooks = (int)local_b8._M_impl.super__Vector_impl_data._M_start;
    libraries[lVar10].signupProcess =
         (int)local_d8.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    libraries[lVar10].shipTime = (int)local_98._M_impl.super__Vector_impl_data._M_start;
    std::vector<int,_std::allocator<int>_>::operator=
              (&libraries[lVar10].booksList,(vector<int,_std::allocator<int>_> *)local_78);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)local_78);
  }
  std::__sort<library*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(library,library)>>
            (libraries,libraries + local_ec,(_Iter_comp_iter<bool_(*)(library,_library)>)0x101316);
  local_60 = (_Base_ptr)&piStack_70;
  piStack_70 = (pointer)((ulong)piStack_70 & 0xffffffff00000000);
  local_68 = (_Base_ptr)0x0;
  local_50 = 0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar10 = 0;
  iVar7 = local_e0;
  local_58 = local_60;
  while (lVar10 < local_ec) {
    iVar7 = iVar7 - libraries[lVar10].signupProcess;
    if (iVar7 < 0) break;
    uVar4 = (long)libraries[lVar10].booksList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)libraries[lVar10].booksList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    iVar1 = libraries[lVar10].shipTime;
    iVar6 = ((int)(uVar4 / (ulong)(long)iVar1) + 1) - (uint)(uVar4 % (ulong)(long)iVar1 == 0);
    if (iVar7 <= iVar6) {
      iVar6 = iVar7;
    }
    local_e8.first = libraries[lVar10].libraryNo;
    local_e8.second = iVar6 * iVar1;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_b8,
               &local_e8);
    local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_80 = lVar10 + 1;
    local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar8 = 0;
    for (uVar4 = 0;
        (piVar2 = libraries[lVar10].booksList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar4 < (ulong)((long)libraries[lVar10].booksList.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar2 >> 2) &&
        ((int)uVar4 < iVar6 * iVar1)); uVar4 = uVar4 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_98,(value_type *)((long)piVar2 + lVar8)
                );
      lVar8 = lVar8 + 4;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&local_d8,(value_type *)&local_98);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
    lVar10 = local_80;
  }
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar10);
  std::endl<char,std::char_traits<char>>(poVar5);
  for (uVar4 = 0;
      uVar4 < (ulong)((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_b8._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar4 = uVar4 + 1) {
    poVar5 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,
                        local_b8._M_impl.super__Vector_impl_data._M_start[uVar4].first);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    for (uVar9 = 0;
        piVar2 = local_d8.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar4].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start,
        uVar9 < (ulong)((long)local_d8.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar4].
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
        uVar9 = uVar9 + 1) {
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar2[uVar9]);
      std::operator<<(poVar5," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  fclose(_stdin);
  fclose(_stdout);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_d8);
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&local_b8);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return 0;
}

Assistant:

int main()
{
    sync;
    inputa;
    outputa;
   /* inputb;
    outputb;
    inputc;
    outputc;
   inputd;
    outputd;
    inpute;
    outpute;
   inputf;
    outputf;*/

    int b, l, d;
    cin>>b>>l>>d;

    vector<int> booksScores;
    for(int i=0;i<b;i++)
    {
        int temp;
        cin>>temp;
        booksScores.push_back(temp);
    }
    for(int i=0;i<l;i++)
    {
        int bk, stime,shiplimit;
        cin>>bk>>stime>>shiplimit;
        vector<int> lists;
        for(int j=0;j<bk;j++)
        {
            int temp;
            cin>>temp;
            lists.push_back(temp);
        }
        libraries[i].libraryNo = i;
        libraries[i].noOfBooks= bk;
        libraries[i].signupProcess = stime;
        libraries[i].shipTime = shiplimit;
        libraries[i].booksList=lists;
    }
    sort(libraries, libraries+l, compareTwoLibrary);
    int time = d;
    int totalLibrary = 0;
    map<int,int> mp;
    vector<pair<int,int>> liblist;
    vector<vector<int>> bkList;
    for(int i=0;i<l;i++)
    {
        if(time - libraries[i].signupProcess >= 0)
            time -= libraries[i].signupProcess;
        else break;

        totalLibrary++;
        int noCanbetaken = 0;
        int tempdays = libraries[i].booksList.size() / libraries[i].shipTime;
        if (libraries[i].booksList.size() % libraries[i].shipTime !=0)
            tempdays += 1;
        if(tempdays > time)
        {
            noCanbetaken = time * libraries[i].shipTime;
        } else
        {
            noCanbetaken =((tempdays) * libraries[i].shipTime);
        }
        pair<int,int> tp;
        tp.first = libraries[i].libraryNo;
        tp.second = noCanbetaken;
        liblist.push_back(tp);
        int cnt = 0;
        vector<int> lt;
        for(int j=0;j<libraries[i].booksList.size();j++,cnt++)
        {
            if(cnt >= noCanbetaken) break;
            /*if(mp[libraries[i].booksList[j]] == 0)
            {
                mp[libraries[i].booksList[j]] = 1;

            }*/
            lt.push_back(libraries[i].booksList[j]);
        }
        bkList.push_back(lt);

    }
    cout<<totalLibrary<<endl;
    for(int i=0;i<liblist.size();i++)
    {
        cout<<liblist[i].first<<" "<<bkList[i].size()<<endl;
        for(int j=0;j<bkList[i].size();j++)
        {
            cout<<bkList[i][j]<<" ";
        }
        cout<<endl;
    }
    cout<<endl;
    fclose(stdin);
    fclose(stdout);
    return 0;
}